

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::bump_variables(Internal *this)

{
  bool bVar1;
  time_t *in_RSI;
  int **__timer;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  double s;
  double s_00;
  int *lit;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  size_t N;
  analyze_bumped_rank in_stack_000008b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_000008b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_000008c0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  Internal *pIVar2;
  Internal *in_stack_ffffffffffffff70;
  Profile *profile;
  analyze_bumped_smaller in_stack_ffffffffffffff80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff90;
  int *local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  vector<int,_std::allocator<int>_> *local_58;
  analyze_bumped_rank local_50;
  int *local_48;
  int *local_40;
  analyze_bumped_smaller local_38;
  int *local_30;
  int *local_28;
  int *local_20;
  int *local_18;
  ulong local_10;
  
  if ((((Internal *)in_RDI._M_current)->internal->profiles).bump.level <=
      (((Internal *)in_RDI._M_current)->internal->opts).profile) {
    pIVar2 = ((Internal *)in_RDI._M_current)->internal;
    in_stack_ffffffffffffff80.internal =
         (Internal *)&(((Internal *)in_RDI._M_current)->internal->profiles).bump;
    time(((Internal *)in_RDI._M_current)->internal,in_RSI);
    start_profiling(pIVar2,(Profile *)in_stack_ffffffffffffff80.internal,s);
  }
  if ((((Internal *)in_RDI._M_current)->opts).bumpreason != 0) {
    bump_also_all_reason_literals((Internal *)in_stack_ffffffffffffff90._M_current);
  }
  bVar1 = use_scores((Internal *)in_RDI._M_current);
  if (!bVar1) {
    local_18 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
    local_20 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
    local_10 = __gnu_cxx::operator-
                         ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          in_stack_ffffffffffffff70,
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          in_stack_ffffffffffffff68);
    if ((ulong)(long)(((Internal *)in_RDI._M_current)->opts).radixsortlim < local_10) {
      local_40 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
      local_48 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
      analyze_bumped_rank::analyze_bumped_rank(&local_50,(Internal *)in_RDI._M_current);
      rsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,CaDiCaL::analyze_bumped_rank>
                (in_stack_000008c0,in_stack_000008b8,in_stack_000008b0);
    }
    else {
      local_28 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
      local_30 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
      analyze_bumped_smaller::analyze_bumped_smaller(&local_38,(Internal *)in_RDI._M_current);
      std::
      sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,CaDiCaL::analyze_bumped_smaller>
                (in_stack_ffffffffffffff90,in_RDI,in_stack_ffffffffffffff80);
    }
  }
  local_58 = &((Internal *)in_RDI._M_current)->analyzed;
  local_60._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
  local_68 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
  while( true ) {
    __timer = &local_68;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff70,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff68);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_60);
    bump_variable(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_60);
  }
  bVar1 = use_scores((Internal *)in_RDI._M_current);
  if (bVar1) {
    bump_variable_score_inc(in_stack_ffffffffffffff80.internal);
  }
  if ((((Internal *)in_RDI._M_current)->internal->profiles).bump.level <=
      (((Internal *)in_RDI._M_current)->internal->opts).profile) {
    pIVar2 = ((Internal *)in_RDI._M_current)->internal;
    profile = &(((Internal *)in_RDI._M_current)->internal->profiles).bump;
    time(((Internal *)in_RDI._M_current)->internal,(time_t *)__timer);
    stop_profiling(pIVar2,profile,s_00);
  }
  return;
}

Assistant:

void Internal::bump_variables () {

  assert (opts.bump);

  START (bump);

  if (opts.bumpreason)
    bump_also_all_reason_literals ();

  if (!use_scores ()) {

    // Variables are bumped in the order they are in the current decision
    // queue.  This maintains relative order between bumped variables in
    // the queue and seems to work best.  We also experimented with
    // focusing on variables of the last decision level, but results were
    // mixed.

    MSORT (opts.radixsortlim, analyzed.begin (), analyzed.end (),
           analyze_bumped_rank (this), analyze_bumped_smaller (this));
  }

  for (const auto &lit : analyzed)
    bump_variable (lit);

  if (use_scores ())
    bump_variable_score_inc ();

  STOP (bump);
}